

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.cpp
# Opt level: O1

size_t duckdb_zstd::HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  byte *pbVar1;
  U32 *pUVar2;
  int *piVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  bool bVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  size_t __n;
  size_t sVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  if (sourceSize == 0) {
    sVar14 = 0;
    switchD_0105b559::default(count,0,__n);
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar1 = (byte *)((long)source + sourceSize);
    switchD_0105b559::default(workSpace,0,0x1000);
    if (0x13 < (long)sourceSize) {
      pbVar9 = (byte *)((sourceSize - 0xf) + (long)source);
      uVar16 = *source;
      pbVar12 = (byte *)source;
      do {
        uVar21 = *(uint *)(pbVar12 + 4);
        workSpace[uVar16 & 0xff] = workSpace[uVar16 & 0xff] + 1;
        workSpace[(ulong)(uVar16 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar16 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar16 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar16 >> 0x18) + 0x300] = workSpace[(ulong)(uVar16 >> 0x18) + 0x300] + 1;
        uVar16 = *(uint *)(pbVar12 + 8);
        workSpace[uVar21 & 0xff] = workSpace[uVar21 & 0xff] + 1;
        workSpace[(ulong)(uVar21 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar21 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar21 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar21 >> 0x18) + 0x300] = workSpace[(ulong)(uVar21 >> 0x18) + 0x300] + 1;
        uVar21 = *(uint *)(pbVar12 + 0xc);
        workSpace[uVar16 & 0xff] = workSpace[uVar16 & 0xff] + 1;
        workSpace[(ulong)(uVar16 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar16 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar16 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar16 >> 0x18) + 0x300] = workSpace[(ulong)(uVar16 >> 0x18) + 0x300] + 1;
        uVar16 = *(uint *)(pbVar12 + 0x10);
        workSpace[uVar21 & 0xff] = workSpace[uVar21 & 0xff] + 1;
        workSpace[(ulong)(uVar21 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar21 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar21 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar21 >> 0x18) + 0x300] = workSpace[(ulong)(uVar21 >> 0x18) + 0x300] + 1;
        source = pbVar12 + 0x10;
        pbVar13 = pbVar12 + 0x14;
        pbVar12 = (byte *)source;
      } while (pbVar13 < pbVar9);
    }
    for (; source < pbVar1; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    uVar16 = 0;
    uVar21 = 0;
    uVar20 = 0;
    uVar8 = 0;
    lVar10 = 0;
    do {
      pUVar4 = workSpace + lVar10 + 0x100;
      pUVar5 = workSpace + lVar10 + 0x200;
      pUVar6 = workSpace + lVar10 + 0x300;
      pUVar2 = workSpace + lVar10;
      uVar22 = *pUVar2 + *pUVar6 + *pUVar5 + *pUVar4;
      uVar23 = pUVar2[1] + pUVar6[1] + pUVar5[1] + pUVar4[1];
      uVar24 = pUVar2[2] + pUVar6[2] + pUVar5[2] + pUVar4[2];
      uVar25 = pUVar2[3] + pUVar6[3] + pUVar5[3] + pUVar4[3];
      pUVar2 = workSpace + lVar10;
      *pUVar2 = uVar22;
      pUVar2[1] = uVar23;
      pUVar2[2] = uVar24;
      pUVar2[3] = uVar25;
      uVar15 = -(uint)((int)(uVar16 ^ 0x80000000) < (int)(uVar22 ^ 0x80000000));
      uVar17 = -(uint)((int)(uVar21 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
      uVar18 = -(uint)((int)(uVar20 ^ 0x80000000) < (int)(uVar24 ^ 0x80000000));
      uVar19 = -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar25 ^ 0x80000000));
      uVar16 = ~uVar15 & uVar16 | uVar22 & uVar15;
      uVar21 = ~uVar17 & uVar21 | uVar23 & uVar17;
      uVar20 = ~uVar18 & uVar20 | uVar24 & uVar18;
      uVar8 = ~uVar19 & uVar8 | uVar25 & uVar19;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x100);
    uVar15 = -(uint)((int)(uVar20 ^ 0x80000000) < (int)(uVar16 ^ 0x80000000));
    uVar17 = -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar21 ^ 0x80000000));
    uVar20 = ~uVar15 & uVar20 | uVar16 & uVar15;
    uVar21 = ~uVar17 & uVar8 | uVar21 & uVar17;
    uVar16 = -(uint)((int)(uVar21 ^ 0x80000000) < (int)(uVar20 ^ 0x80000000));
    uVar11 = 0x100;
    do {
      uVar8 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar8;
    } while (workSpace[uVar11] == 0);
    if ((check == trustInput) || (uVar8 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = uVar8;
      memmove(count,workSpace,__n);
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    sVar14 = 0xffffffffffffffd0;
    if (bVar7) {
      sVar14 = (ulong)(~uVar16 & uVar21 | uVar20 & uVar16);
    }
  }
  return sVar14;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}